

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O3

int Aig_ManAddNewCnfToSolver
              (sat_solver *pSat,Aig_Man_t *pAig,Vec_Int_t *vNode2Var,Vec_Int_t *vPioIds,
              Vec_Ptr_t *vPartPos,int fAlignPol)

{
  byte *pbVar1;
  lit *begin;
  lit *end;
  void *pvVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  Cnf_Dat_t *pCVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  ulong uVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  int Lits [2];
  uint local_78;
  int local_74;
  Cnf_Dat_t *local_70;
  Aig_Man_t *local_68;
  Vec_Int_t *local_60;
  sat_solver *local_58;
  int local_4c;
  Vec_Ptr_t *local_48;
  Vec_Int_t *local_40;
  void *local_38;
  
  local_68 = pAig;
  local_4c = fAlignPol;
  local_48 = vPartPos;
  pCVar6 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Cnf_DataTranformPolarity(pCVar6,1);
  iVar5 = sat_solver_nvars(pSat);
  Cnf_DataLift(pCVar6,iVar5);
  iVar5 = sat_solver_nvars(pSat);
  local_70 = pCVar6;
  sat_solver_setnvars(pSat,iVar5 + pCVar6->nVars);
  lVar11 = 0;
  while (lVar11 < local_70->nClauses) {
    begin = local_70->pClauses[lVar11];
    if ((begin == (lit *)0x0) || (end = local_70->pClauses[lVar11 + 1], end == (lit *)0x0)) break;
    iVar5 = sat_solver_addclause(pSat,begin,end);
    lVar11 = lVar11 + 1;
    if (iVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                    ,0x18b,
                    "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                   );
    }
  }
  pVVar7 = local_68->vCis;
  local_60 = vPioIds;
  local_58 = pSat;
  local_40 = vNode2Var;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pSat = local_58;
      if (local_60->nSize <= lVar11) goto LAB_006cc0e3;
      lVar8 = (long)local_60->pArray[lVar11];
      if ((lVar8 < 0) || (local_40->nSize <= local_60->pArray[lVar11])) goto LAB_006cc0e3;
      pvVar2 = pVVar7->pArray[lVar11];
      iVar5 = local_40->pArray[lVar8];
      if (iVar5 == 0) {
        local_40->pArray[lVar8] = local_70->pVarNums[*(int *)((long)pvVar2 + 0x24)];
      }
      else {
        uVar3 = iVar5 * 2;
        local_74 = local_70->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2 + 1;
        local_78 = uVar3;
        iVar5 = sat_solver_addclause(local_58,(lit *)&local_78,(lit *)&local_70);
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x19d,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = uVar3 | 1;
        local_74 = local_70->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2;
        iVar5 = sat_solver_addclause(pSat,(lit *)&local_78,(lit *)&local_70);
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1a1,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        pVVar7 = local_68->vCis;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar7->nSize);
  }
  pVVar7 = local_68->vCos;
  pVVar10 = local_40;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    do {
      pSat = local_58;
      pCVar6 = local_70;
      uVar9 = (ulong)(uint)local_68->nObjs[2] + lVar11;
      iVar5 = (int)uVar9;
      if ((iVar5 < 0) || (local_60->nSize <= iVar5)) goto LAB_006cc0e3;
      lVar8 = (long)local_60->pArray[uVar9 & 0xffffffff];
      if ((lVar8 < 0) || (pVVar10->nSize <= local_60->pArray[uVar9 & 0xffffffff]))
      goto LAB_006cc0e3;
      pvVar2 = pVVar7->pArray[lVar11];
      iVar5 = pVVar10->pArray[lVar8];
      if (iVar5 == 0) {
        pVVar10->pArray[lVar8] = local_70->pVarNums[*(int *)((long)pvVar2 + 0x24)];
      }
      else {
        uVar3 = iVar5 * 2;
        local_74 = local_70->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2 + 1;
        local_78 = uVar3;
        local_38 = pvVar2;
        iVar5 = sat_solver_addclause(local_58,(lit *)&local_78,(lit *)&local_70);
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1b2,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = uVar3 | 1;
        local_74 = pCVar6->pVarNums[*(int *)((long)local_38 + 0x24)] * 2;
        iVar5 = sat_solver_addclause(pSat,(lit *)&local_78,(lit *)&local_70);
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1b6,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        pVVar7 = local_68->vCos;
        pVVar10 = local_40;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar7->nSize);
  }
  pVVar4 = local_60;
  if (0 < pVVar10->nSize) {
    if (*pVVar10->pArray == 0) {
      *pVVar10->pArray = *local_70->pVarNums;
    }
    Cnf_DataFree(local_70);
    if (0 < local_48->nSize) {
      lVar11 = 0;
      do {
        uVar9 = *(ulong *)((long)local_48->pArray[lVar11] + 8);
        if (uVar9 == 0) goto LAB_006cc0e3;
        iVar5 = *(int *)((uVar9 & 0xfffffffffffffffe) + 0x24);
        if (((long)iVar5 < 0) || (pVVar10->nSize <= iVar5)) goto LAB_006cc0e3;
        if (pVVar10->pArray[iVar5] == 0) {
          __assert_fail("iSatVarOld != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1c2,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        local_78 = ((uint)uVar9 & 1) + pVVar10->pArray[iVar5] * 2;
        if ((local_4c != 0) && ((*(byte *)((uVar9 & 0xfffffffffffffffe) + 0x18) & 8) != 0)) {
          local_78 = local_78 ^ 1;
        }
        iVar5 = sat_solver_addclause(pSat,(lit *)&local_78,&local_74);
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                        ,0x1ca,
                        "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                       );
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_48->nSize);
    }
    pVVar7 = local_68->vCis;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar11];
        uVar9 = *(ulong *)((long)pvVar2 + 0x18);
        if ((uVar9 & 0x30) != 0) {
          if (pVVar4->nSize <= lVar11) goto LAB_006cc0e3;
          iVar5 = pVVar4->pArray[lVar11];
          if (((long)iVar5 < 0) || (pVVar10->nSize <= iVar5)) goto LAB_006cc0e3;
          local_78 = ((uint)(uVar9 >> 4) & 1) + pVVar10->pArray[iVar5] * 2;
          iVar5 = sat_solver_addclause(pSat,(lit *)&local_78,&local_74);
          if (iVar5 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                          ,0x1d8,
                          "int Aig_ManAddNewCnfToSolver(sat_solver *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, int)"
                         );
          }
          pbVar1 = (byte *)((long)pvVar2 + 0x18);
          *pbVar1 = *pbVar1 & 0xcf;
          pVVar7 = local_68->vCis;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar7->nSize);
    }
    return 0;
  }
LAB_006cc0e3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Aig_ManAddNewCnfToSolver( sat_solver * pSat, Aig_Man_t * pAig, Vec_Int_t * vNode2Var, 
                             Vec_Int_t * vPioIds, Vec_Ptr_t * vPartPos, int fAlignPol )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int * pBeg, * pEnd;
    int i, Lits[2], iSatVarOld, iNodeIdOld;
    // derive CNF and express it using new SAT variables
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    Cnf_DataTranformPolarity( pCnf, 1 );
    Cnf_DataLift( pCnf, sat_solver_nvars(pSat) );
    // create new variables in the SAT solver
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + pCnf->nVars );
    // add clauses for this CNF
    Cnf_CnfForClause( pCnf, pBeg, pEnd, i )
        if ( !sat_solver_addclause( pSat, pBeg, pEnd ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    // derive the connector clauses
    Aig_ManForEachCi( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // derive the connector clauses
    Aig_ManForEachCo( pAig, pObj, i )
    {
        iNodeIdOld = Vec_IntEntry( vPioIds, Aig_ManCiNum(pAig) + i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        if ( iSatVarOld == 0 ) // iNodeIdOld in the original AIG has no SAT var
        { 
            // map the corresponding original AIG node into this SAT var
            Vec_IntWriteEntry( vNode2Var, iNodeIdOld, pCnf->pVarNums[Aig_ObjId(pObj)] );
            continue;
        }
        // add connector clauses 
        Lits[0] = toLitCond( iSatVarOld, 0 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( iSatVarOld, 1 );
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    // transfer the ID of constant 1 node
    if ( Vec_IntEntry( vNode2Var, 0 ) == 0 )
        Vec_IntWriteEntry( vNode2Var, 0, pCnf->pVarNums[0] );
    // remove the CNF
    Cnf_DataFree( pCnf );
    // constrain the solver with the literals corresponding to the original POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPartPos, pObj, i )
    {
        iNodeIdOld = Aig_ObjFaninId0( pObj );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        assert( iSatVarOld != 0 );
        // assert the original PO to be 1
        Lits[0] = toLitCond( iSatVarOld, Aig_ObjFaninC0(pObj) );
        // correct the polarity if polarity alignment is enabled
        if ( fAlignPol && Aig_ObjFanin0(pObj)->fPhase ) 
            Lits[0] = lit_neg( Lits[0] );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
    }
    // constrain some the primary inputs to constant values
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( !pObj->fMarkA && !pObj->fMarkB )
            continue;
        iNodeIdOld = Vec_IntEntry( vPioIds, i );
        iSatVarOld = Vec_IntEntry( vNode2Var, iNodeIdOld );
        Lits[0] = toLitCond( iSatVarOld, pObj->fMarkA );
        if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
        {
            assert( 0 ); // if it happens, can return 1 (unsatisfiable)
            return 1;
        }
        pObj->fMarkA = pObj->fMarkB = 0;
    }
    return 0;
}